

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall QListView::setItemAlignment(QListView *this,Alignment alignment)

{
  QAbstractItemViewPrivate *this_00;
  long lVar1;
  
  this_00 = *(QAbstractItemViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if ((QFlagsStorage<Qt::AlignmentFlag>)
      *(QFlagsStorage<Qt::AlignmentFlag> *)
       &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.extra.
        _M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
        super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
        super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl !=
      (QFlagsStorage<Qt::AlignmentFlag>)
      alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
      super_QFlagsStorage<Qt::AlignmentFlag>.i) {
    *(QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)
     &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.extra.
      _M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
      super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
      super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl =
         alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i;
    lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                      super_QWidget.field_0x8;
    if (((*(int *)(lVar1 + 0x568) == 0) && (*(int *)(lVar1 + 0x558) == 1)) &&
       (*(char *)(lVar1 + 0x548) == '\x01')) {
      QAbstractItemViewPrivate::doDelayedItemsLayout(this_00,0);
      return;
    }
  }
  return;
}

Assistant:

void QListView::setItemAlignment(Qt::Alignment alignment)
{
    Q_D(QListView);
    if (d->itemAlignment == alignment)
        return;
    d->itemAlignment = alignment;
    if (viewMode() == ListMode && flow() == QListView::TopToBottom && isWrapping())
        d->doDelayedItemsLayout();
}